

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JsonReporter::listTags
          (JsonReporter *this,vector<Catch::TagInfo,_std::allocator<Catch::TagInfo>_> *tags)

{
  pointer pTVar1;
  _Rb_tree_node_base *p_Var2;
  int __fd;
  _Elt_pointer pJVar3;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range3;
  pointer pTVar4;
  JsonArrayWriter writer;
  JsonArrayWriter aliases_writer;
  JsonObjectWriter tag_writer;
  StringRef alias;
  
  startListing(this);
  pJVar3 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar3 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar3 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&alias,(int)pJVar3 + -0x18,"tags",4);
  JsonValueWriter::writeArray(&writer,(JsonValueWriter *)&alias);
  std::__cxx11::stringstream::~stringstream((stringstream *)&alias.m_size);
  pTVar1 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pTVar4 = (tags->super__Vector_base<Catch::TagInfo,_std::allocator<Catch::TagInfo>_>)._M_impl.
                super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    JsonArrayWriter::writeObject(&tag_writer,&writer);
    __fd = (int)&tag_writer;
    JsonObjectWriter::write((JsonObjectWriter *)&alias,__fd,"aliases",7);
    JsonValueWriter::writeArray(&aliases_writer,(JsonValueWriter *)&alias);
    std::__cxx11::stringstream::~stringstream((stringstream *)&alias.m_size);
    for (p_Var2 = (pTVar4->spellings)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(pTVar4->spellings)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      alias.m_start = *(char **)(p_Var2 + 1);
      alias.m_size = (size_type)p_Var2[1]._M_parent;
      JsonArrayWriter::writeImpl<Catch::StringRef>(&aliases_writer,&alias);
    }
    JsonArrayWriter::~JsonArrayWriter(&aliases_writer);
    JsonObjectWriter::write((JsonObjectWriter *)&alias,__fd,"count",5);
    JsonValueWriter::write<unsigned_long>((JsonValueWriter *)&alias,&pTVar4->count);
    std::__cxx11::stringstream::~stringstream((stringstream *)&alias.m_size);
    JsonObjectWriter::~JsonObjectWriter(&tag_writer);
  }
  JsonArrayWriter::~JsonArrayWriter(&writer);
  return;
}

Assistant:

void JsonReporter::listTags( std::vector<TagInfo> const& tags ) {
        startListing();

        auto writer = m_objectWriters.top().write( "tags"_sr ).writeArray();
        for ( auto const& tag : tags ) {
            auto tag_writer = writer.writeObject();
            {
                auto aliases_writer =
                    tag_writer.write( "aliases"_sr ).writeArray();
                for ( auto alias : tag.spellings ) {
                    aliases_writer.write( alias );
                }
            }
            tag_writer.write( "count"_sr ).write( tag.count );
        }
    }